

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmGetFilenameWithoutExtension(char *name)

{
  char *pcVar1;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string sres;
  char *name_local;
  
  sres.field_2._8_8_ = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  std::__cxx11::string::~string((string *)local_30);
  return pcVar1;
}

Assistant:

char* CCONV cmGetFilenameWithoutExtension(const char* name)
{
  std::string sres = cmSystemTools::GetFilenameWithoutExtension(name);
  return strdup(sres.c_str());
}